

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto3_unittest::TestPackedTypes::_InternalSerialize
          (TestPackedTypes *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<unsigned_int> *pRVar2;
  RepeatedField<unsigned_long> *pRVar3;
  RepeatedField<int> *pRVar4;
  RepeatedField<float> *this_00;
  RepeatedField<double> *this_01;
  RepeatedField<bool> *this_02;
  int *piVar5;
  ulong *puVar6;
  uint *puVar7;
  long *plVar8;
  int iVar9;
  uint uVar10;
  uint8_t *puVar11;
  const_pointer piVar12;
  byte *pbVar13;
  ulong uVar14;
  ulong *puVar15;
  const_pointer puVar16;
  const_pointer puVar17;
  unsigned_long uVar18;
  const_pointer plVar19;
  const_pointer puVar20;
  const_pointer data;
  const_pointer data_00;
  const_pointer data_01;
  uint uVar21;
  LogMessageFatal local_40;
  
  uVar21 = *(uint *)((long)&this->field_0 + 0x10);
  if (0 < (int)uVar21) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar11) goto LAB_00a6b48b;
    puVar11[0] = 0xd2;
    puVar11[1] = '\x05';
    target = puVar11 + 3;
    for (; 0x7f < uVar21; uVar21 = uVar21 >> 7) {
      target[-1] = (byte)uVar21 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar21;
    piVar12 = google::protobuf::RepeatedField<int>::data(&(this->field_0)._impl_.packed_int32_);
    iVar9 = google::protobuf::RepeatedField<int>::size(&(this->field_0)._impl_.packed_int32_);
    piVar5 = piVar12 + iVar9;
    do {
      pbVar13 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar14 = (ulong)*piVar12; target = pbVar13 + 1, 0x7f < uVar14; uVar14 = uVar14 >> 7) {
        *pbVar13 = (byte)uVar14 | 0x80;
        pbVar13 = target;
      }
      piVar12 = piVar12 + 1;
      *pbVar13 = (byte)uVar14;
    } while (piVar12 < piVar5);
  }
  uVar21 = *(uint *)((long)&this->field_0 + 0x28);
  if (0 < (int)uVar21) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar11) goto LAB_00a6b48b;
    pRVar1 = &(this->field_0)._impl_.packed_int64_;
    puVar11[0] = 0xda;
    puVar11[1] = '\x05';
    target = puVar11 + 3;
    for (; 0x7f < uVar21; uVar21 = uVar21 >> 7) {
      target[-1] = (byte)uVar21 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar21;
    puVar15 = (ulong *)google::protobuf::RepeatedField<long>::data(pRVar1);
    iVar9 = google::protobuf::RepeatedField<long>::size(pRVar1);
    puVar6 = puVar15 + iVar9;
    do {
      pbVar13 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar14 = *puVar15; target = pbVar13 + 1, 0x7f < uVar14; uVar14 = uVar14 >> 7) {
        *pbVar13 = (byte)uVar14 | 0x80;
        pbVar13 = target;
      }
      puVar15 = puVar15 + 1;
      *pbVar13 = (byte)uVar14;
    } while (puVar15 < puVar6);
  }
  uVar21 = *(uint *)((long)&this->field_0 + 0x40);
  if (0 < (int)uVar21) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar11) goto LAB_00a6b48b;
    pRVar2 = &(this->field_0)._impl_.packed_uint32_;
    puVar11[0] = 0xe2;
    puVar11[1] = '\x05';
    target = puVar11 + 3;
    for (; 0x7f < uVar21; uVar21 = uVar21 >> 7) {
      target[-1] = (byte)uVar21 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar21;
    puVar16 = google::protobuf::RepeatedField<unsigned_int>::data(pRVar2);
    iVar9 = google::protobuf::RepeatedField<unsigned_int>::size(pRVar2);
    puVar7 = puVar16 + iVar9;
    do {
      pbVar13 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar21 = *puVar16;
      while( true ) {
        target = pbVar13 + 1;
        if (uVar21 < 0x80) break;
        *pbVar13 = (byte)uVar21 | 0x80;
        uVar21 = uVar21 >> 7;
        pbVar13 = target;
      }
      puVar16 = puVar16 + 1;
      *pbVar13 = (byte)uVar21;
    } while (puVar16 < puVar7);
  }
  uVar21 = *(uint *)((long)&this->field_0 + 0x58);
  if (0 < (int)uVar21) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar11) goto LAB_00a6b48b;
    pRVar3 = &(this->field_0)._impl_.packed_uint64_;
    puVar11[0] = 0xea;
    puVar11[1] = '\x05';
    target = puVar11 + 3;
    for (; 0x7f < uVar21; uVar21 = uVar21 >> 7) {
      target[-1] = (byte)uVar21 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar21;
    puVar17 = google::protobuf::RepeatedField<unsigned_long>::data(pRVar3);
    iVar9 = google::protobuf::RepeatedField<unsigned_long>::size(pRVar3);
    puVar20 = puVar17 + iVar9;
    do {
      pbVar13 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar18 = *puVar17; target = pbVar13 + 1, 0x7f < uVar18; uVar18 = uVar18 >> 7) {
        *pbVar13 = (byte)uVar18 | 0x80;
        pbVar13 = target;
      }
      puVar17 = puVar17 + 1;
      *pbVar13 = (byte)uVar18;
    } while (puVar17 < puVar20);
  }
  uVar21 = *(uint *)((long)&this->field_0 + 0x70);
  if (0 < (int)uVar21) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar11) goto LAB_00a6b48b;
    pRVar4 = &(this->field_0)._impl_.packed_sint32_;
    puVar11[0] = 0xf2;
    puVar11[1] = '\x05';
    target = puVar11 + 3;
    for (; 0x7f < uVar21; uVar21 = uVar21 >> 7) {
      target[-1] = (byte)uVar21 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar21;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar4);
    iVar9 = google::protobuf::RepeatedField<int>::size(pRVar4);
    piVar5 = piVar12 + iVar9;
    do {
      pbVar13 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar21 = *piVar12 >> 0x1f ^ *piVar12 * 2;
      while( true ) {
        target = pbVar13 + 1;
        if (uVar21 < 0x80) break;
        *pbVar13 = (byte)uVar21 | 0x80;
        uVar21 = uVar21 >> 7;
        pbVar13 = target;
      }
      piVar12 = piVar12 + 1;
      *pbVar13 = (byte)uVar21;
    } while (piVar12 < piVar5);
  }
  uVar21 = *(uint *)((long)&this->field_0 + 0x88);
  if (0 < (int)uVar21) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar11) goto LAB_00a6b48b;
    pRVar1 = &(this->field_0)._impl_.packed_sint64_;
    puVar11[0] = 0xfa;
    puVar11[1] = '\x05';
    target = puVar11 + 3;
    for (; 0x7f < uVar21; uVar21 = uVar21 >> 7) {
      target[-1] = (byte)uVar21 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar21;
    plVar19 = google::protobuf::RepeatedField<long>::data(pRVar1);
    iVar9 = google::protobuf::RepeatedField<long>::size(pRVar1);
    plVar8 = plVar19 + iVar9;
    do {
      pbVar13 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar14 = *plVar19 >> 0x3f ^ *plVar19 * 2; target = pbVar13 + 1, 0x7f < uVar14;
          uVar14 = uVar14 >> 7) {
        *pbVar13 = (byte)uVar14 | 0x80;
        pbVar13 = target;
      }
      plVar19 = plVar19 + 1;
      *pbVar13 = (byte)uVar14;
    } while (plVar19 < plVar8);
  }
  pRVar2 = &(this->field_0)._impl_.packed_fixed32_;
  iVar9 = google::protobuf::RepeatedField<unsigned_int>::size(pRVar2);
  if (0 < iVar9) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar9 = google::protobuf::RepeatedField<unsigned_int>::size(pRVar2);
    if (stream->end_ <= puVar11) goto LAB_00a6b48b;
    puVar11[0] = 0x82;
    puVar11[1] = '\x06';
    puVar11 = puVar11 + 3;
    for (uVar21 = iVar9 << 2; 0x7f < uVar21; uVar21 = uVar21 >> 7) {
      puVar11[-1] = (byte)uVar21 | 0x80;
      puVar11 = puVar11 + 1;
    }
    puVar11[-1] = (byte)uVar21;
    puVar16 = google::protobuf::RepeatedField<unsigned_int>::data(pRVar2);
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw(stream,puVar16,iVar9 << 2,puVar11);
  }
  pRVar3 = &(this->field_0)._impl_.packed_fixed64_;
  iVar9 = google::protobuf::RepeatedField<unsigned_long>::size(pRVar3);
  if (0 < iVar9) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar9 = google::protobuf::RepeatedField<unsigned_long>::size(pRVar3);
    if (stream->end_ <= puVar11) goto LAB_00a6b48b;
    puVar11[0] = 0x8a;
    puVar11[1] = '\x06';
    puVar11 = puVar11 + 3;
    for (uVar21 = iVar9 << 3; 0x7f < uVar21; uVar21 = uVar21 >> 7) {
      puVar11[-1] = (byte)uVar21 | 0x80;
      puVar11 = puVar11 + 1;
    }
    puVar11[-1] = (byte)uVar21;
    puVar20 = google::protobuf::RepeatedField<unsigned_long>::data(pRVar3);
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw(stream,puVar20,iVar9 << 3,puVar11);
  }
  pRVar4 = &(this->field_0)._impl_.packed_sfixed32_;
  iVar9 = google::protobuf::RepeatedField<int>::size(pRVar4);
  if (0 < iVar9) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar9 = google::protobuf::RepeatedField<int>::size(pRVar4);
    if (stream->end_ <= puVar11) goto LAB_00a6b48b;
    puVar11[0] = 0x92;
    puVar11[1] = '\x06';
    puVar11 = puVar11 + 3;
    for (uVar21 = iVar9 << 2; 0x7f < uVar21; uVar21 = uVar21 >> 7) {
      puVar11[-1] = (byte)uVar21 | 0x80;
      puVar11 = puVar11 + 1;
    }
    puVar11[-1] = (byte)uVar21;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar4);
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw(stream,piVar12,iVar9 << 2,puVar11);
  }
  pRVar1 = &(this->field_0)._impl_.packed_sfixed64_;
  iVar9 = google::protobuf::RepeatedField<long>::size(pRVar1);
  if (0 < iVar9) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar9 = google::protobuf::RepeatedField<long>::size(pRVar1);
    if (stream->end_ <= puVar11) goto LAB_00a6b48b;
    puVar11[0] = 0x9a;
    puVar11[1] = '\x06';
    puVar11 = puVar11 + 3;
    for (uVar21 = iVar9 << 3; 0x7f < uVar21; uVar21 = uVar21 >> 7) {
      puVar11[-1] = (byte)uVar21 | 0x80;
      puVar11 = puVar11 + 1;
    }
    puVar11[-1] = (byte)uVar21;
    plVar19 = google::protobuf::RepeatedField<long>::data(pRVar1);
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw(stream,plVar19,iVar9 << 3,puVar11);
  }
  this_00 = &(this->field_0)._impl_.packed_float_;
  iVar9 = google::protobuf::RepeatedField<float>::size(this_00);
  if (0 < iVar9) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar9 = google::protobuf::RepeatedField<float>::size(this_00);
    if (stream->end_ <= puVar11) goto LAB_00a6b48b;
    puVar11[0] = 0xa2;
    puVar11[1] = '\x06';
    puVar11 = puVar11 + 3;
    for (uVar21 = iVar9 << 2; 0x7f < uVar21; uVar21 = uVar21 >> 7) {
      puVar11[-1] = (byte)uVar21 | 0x80;
      puVar11 = puVar11 + 1;
    }
    puVar11[-1] = (byte)uVar21;
    data = google::protobuf::RepeatedField<float>::data(this_00);
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw(stream,data,iVar9 << 2,puVar11);
  }
  this_01 = &(this->field_0)._impl_.packed_double_;
  iVar9 = google::protobuf::RepeatedField<double>::size(this_01);
  if (0 < iVar9) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar9 = google::protobuf::RepeatedField<double>::size(this_01);
    if (stream->end_ <= puVar11) goto LAB_00a6b48b;
    puVar11[0] = 0xaa;
    puVar11[1] = '\x06';
    puVar11 = puVar11 + 3;
    for (uVar21 = iVar9 << 3; 0x7f < uVar21; uVar21 = uVar21 >> 7) {
      puVar11[-1] = (byte)uVar21 | 0x80;
      puVar11 = puVar11 + 1;
    }
    puVar11[-1] = (byte)uVar21;
    data_00 = google::protobuf::RepeatedField<double>::data(this_01);
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw(stream,data_00,iVar9 << 3,puVar11);
  }
  this_02 = &(this->field_0)._impl_.packed_bool_;
  iVar9 = google::protobuf::RepeatedField<bool>::size(this_02);
  if (0 < iVar9) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    uVar21 = google::protobuf::RepeatedField<bool>::size(this_02);
    if (stream->end_ <= puVar11) goto LAB_00a6b48b;
    puVar11[0] = 0xb2;
    puVar11[1] = '\x06';
    puVar11 = puVar11 + 3;
    for (uVar10 = uVar21; 0x7f < uVar10; uVar10 = uVar10 >> 7) {
      puVar11[-1] = (byte)uVar10 | 0x80;
      puVar11 = puVar11 + 1;
    }
    puVar11[-1] = (byte)uVar10;
    data_01 = google::protobuf::RepeatedField<bool>::data(this_02);
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw(stream,data_01,uVar21,puVar11);
  }
  uVar21 = (this->field_0)._impl_._packed_enum_cached_byte_size_.atom_;
  if (uVar21 != 0) {
    puVar11 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar11) {
LAB_00a6b48b:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    pRVar4 = &(this->field_0)._impl_.packed_enum_;
    puVar11[0] = 0xba;
    puVar11[1] = '\x06';
    target = puVar11 + 3;
    for (; 0x7f < uVar21; uVar21 = uVar21 >> 7) {
      target[-1] = (byte)uVar21 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar21;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar4);
    iVar9 = google::protobuf::RepeatedField<int>::size(pRVar4);
    piVar5 = piVar12 + iVar9;
    do {
      pbVar13 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar14 = (ulong)*piVar12; target = pbVar13 + 1, 0x7f < uVar14; uVar14 = uVar14 >> 7) {
        *pbVar13 = (byte)uVar14 | 0x80;
        pbVar13 = target;
      }
      piVar12 = piVar12 + 1;
      *pbVar13 = (byte)uVar14;
    } while (piVar12 < piVar5);
  }
  uVar14 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar14 & 1) == 0) {
    return target;
  }
  puVar11 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                      ((UnknownFieldSet *)((uVar14 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar11;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestPackedTypes::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestPackedTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto3_unittest.TestPackedTypes)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 packed_int32 = 90 [packed = true];
  {
    int byte_size = this_._impl_._packed_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          90, this_._internal_packed_int32(), byte_size, target);
    }
  }

  // repeated int64 packed_int64 = 91 [packed = true];
  {
    int byte_size = this_._impl_._packed_int64_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt64Packed(
          91, this_._internal_packed_int64(), byte_size, target);
    }
  }

  // repeated uint32 packed_uint32 = 92 [packed = true];
  {
    int byte_size = this_._impl_._packed_uint32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteUInt32Packed(
          92, this_._internal_packed_uint32(), byte_size, target);
    }
  }

  // repeated uint64 packed_uint64 = 93 [packed = true];
  {
    int byte_size = this_._impl_._packed_uint64_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          93, this_._internal_packed_uint64(), byte_size, target);
    }
  }

  // repeated sint32 packed_sint32 = 94 [packed = true];
  {
    int byte_size = this_._impl_._packed_sint32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteSInt32Packed(
          94, this_._internal_packed_sint32(), byte_size, target);
    }
  }

  // repeated sint64 packed_sint64 = 95 [packed = true];
  {
    int byte_size = this_._impl_._packed_sint64_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteSInt64Packed(
          95, this_._internal_packed_sint64(), byte_size, target);
    }
  }

  // repeated fixed32 packed_fixed32 = 96 [packed = true];
  if (this_._internal_packed_fixed32_size() > 0) {
    target = stream->WriteFixedPacked(96, this_._internal_packed_fixed32(), target);
  }

  // repeated fixed64 packed_fixed64 = 97 [packed = true];
  if (this_._internal_packed_fixed64_size() > 0) {
    target = stream->WriteFixedPacked(97, this_._internal_packed_fixed64(), target);
  }

  // repeated sfixed32 packed_sfixed32 = 98 [packed = true];
  if (this_._internal_packed_sfixed32_size() > 0) {
    target = stream->WriteFixedPacked(98, this_._internal_packed_sfixed32(), target);
  }

  // repeated sfixed64 packed_sfixed64 = 99 [packed = true];
  if (this_._internal_packed_sfixed64_size() > 0) {
    target = stream->WriteFixedPacked(99, this_._internal_packed_sfixed64(), target);
  }

  // repeated float packed_float = 100 [packed = true];
  if (this_._internal_packed_float_size() > 0) {
    target = stream->WriteFixedPacked(100, this_._internal_packed_float(), target);
  }

  // repeated double packed_double = 101 [packed = true];
  if (this_._internal_packed_double_size() > 0) {
    target = stream->WriteFixedPacked(101, this_._internal_packed_double(), target);
  }

  // repeated bool packed_bool = 102 [packed = true];
  if (this_._internal_packed_bool_size() > 0) {
    target = stream->WriteFixedPacked(102, this_._internal_packed_bool(), target);
  }

  // repeated .proto3_unittest.ForeignEnum packed_enum = 103 [packed = true];
  {
    ::size_t byte_size = this_._impl_._packed_enum_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          103, this_._internal_packed_enum(), byte_size, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto3_unittest.TestPackedTypes)
  return target;
}